

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ball.c
# Opt level: O2

int bc_order(void)

{
  obj *poVar1;
  int iVar2;
  vptrs *pvVar3;
  
  iVar2 = 0;
  if ((((uchain->ox == uball->ox) && (uchain->oy == uball->oy)) &&
      (iVar2 = 0, uball->where != '\x03')) && ((u._1052_1_ & 1) == 0)) {
    pvVar3 = (vptrs *)(level->objects[uchain->ox] + uchain->oy);
    do {
      poVar1 = pvVar3->v_nexthere;
      if (poVar1 == (obj *)0x0) {
        impossible("bc_order:  ball&chain not in same location!");
        return 0;
      }
      if (poVar1 == uchain) {
        return 1;
      }
      pvVar3 = &poVar1->v;
    } while (poVar1 != uball);
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

static int bc_order(void)
{
    struct obj *obj;

    if (uchain->ox != uball->ox || uchain->oy != uball->oy || carried(uball)
		|| u.uswallow)
	return BCPOS_DIFFER;

    for (obj = level->objects[uball->ox][uball->oy]; obj; obj = obj->nexthere) {
	if (obj == uchain) return BCPOS_CHAIN;
	if (obj == uball) return BCPOS_BALL;
    }
    impossible("bc_order:  ball&chain not in same location!");
    return BCPOS_DIFFER;
}